

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

ptls_aead_context_t *
new_aead(ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,int is_enc,void *secret,
        ptls_iovec_t hash_value,char *label_prefix)

{
  int iVar1;
  ptls_aead_context_t *__ptr;
  char *label_prefix_00;
  ptls_iovec_t secret_00;
  ptls_iovec_t secret_01;
  uint8_t key [32];
  undefined1 local_58 [40];
  
  __ptr = (ptls_aead_context_t *)malloc(aead->context_size);
  if (__ptr != (ptls_aead_context_t *)0x0) {
    __ptr->algo = aead;
    __ptr->static_iv[0] = '\0';
    __ptr->static_iv[1] = '\0';
    __ptr->static_iv[2] = '\0';
    __ptr->static_iv[3] = '\0';
    __ptr->static_iv[4] = '\0';
    __ptr->static_iv[5] = '\0';
    __ptr->static_iv[6] = '\0';
    __ptr->static_iv[7] = '\0';
    __ptr->static_iv[8] = '\0';
    __ptr->static_iv[9] = '\0';
    __ptr->static_iv[10] = '\0';
    __ptr->static_iv[0xb] = '\0';
    __ptr->static_iv[0xc] = '\0';
    __ptr->static_iv[0xd] = '\0';
    __ptr->static_iv[0xe] = '\0';
    __ptr->static_iv[0xf] = '\0';
    __ptr->dispose_crypto = (_func_void_st_ptls_aead_context_t_ptr *)0x0;
    __ptr->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    __ptr->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    __ptr->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    __ptr->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
          *)0x0;
    label_prefix_00 = "tls13 ";
    if (label_prefix != (char *)0x0) {
      label_prefix_00 = label_prefix;
    }
    secret_00.len = hash->digest_size;
    secret_00.base = (uint8_t *)secret;
    iVar1 = hkdf_expand_label(hash,local_58,aead->key_size,secret_00,"key",hash_value,
                              label_prefix_00);
    if ((iVar1 == 0) &&
       (secret_01.len = hash->digest_size, secret_01.base = (uint8_t *)secret,
       iVar1 = hkdf_expand_label(hash,__ptr->static_iv,aead->iv_size,secret_01,"iv",hash_value,
                                 label_prefix_00), iVar1 == 0)) {
      iVar1 = (*aead->setup_crypto)(__ptr,is_enc,local_58);
      (*ptls_clear_memory)(local_58,aead->key_size);
      if (iVar1 == 0) {
        return __ptr;
      }
    }
    else {
      (*ptls_clear_memory)(local_58,aead->key_size);
    }
    (*ptls_clear_memory)(__ptr->static_iv,aead->iv_size);
    free(__ptr);
  }
  return (ptls_aead_context_t *)0x0;
}

Assistant:

ptls_aead_context_t *new_aead(ptls_aead_algorithm_t *aead, ptls_hash_algorithm_t *hash, int is_enc, const void *secret,
                              ptls_iovec_t hash_value, const char *label_prefix)
{
    ptls_aead_context_t *ctx;
    uint8_t key[PTLS_MAX_SECRET_SIZE];
    int ret;

    if ((ctx = (ptls_aead_context_t *)malloc(aead->context_size)) == NULL)
        return NULL;

    *ctx = (ptls_aead_context_t){aead};
    if ((ret = get_traffic_key(hash, key, aead->key_size, 0, secret, hash_value, label_prefix)) != 0)
        goto Exit;
    if ((ret = get_traffic_key(hash, ctx->static_iv, aead->iv_size, 1, secret, hash_value, label_prefix)) != 0)
        goto Exit;
    ret = aead->setup_crypto(ctx, is_enc, key);

Exit:
    ptls_clear_memory(key, aead->key_size);
    if (ret != 0) {
        ptls_clear_memory(ctx->static_iv, aead->iv_size);
        free(ctx);
        ctx = NULL;
    }

    return ctx;
}